

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O2

REF_STATUS
ref_import_bin_ugrid_c2n(REF_CELL ref_cell,REF_INT ncell,FILE *file,REF_BOOL swap,REF_BOOL fat)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  undefined8 uVar4;
  uint uVar5;
  REF_INT *pRVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  REF_INT new_cell;
  REF_INT *local_d8;
  ulong local_d0;
  FILE *local_c8;
  long local_c0;
  long local_b8;
  REF_CELL local_b0;
  REF_INT nodes [27];
  
  if (0 < ncell) {
    uVar5 = ref_cell->node_per;
    lVar10 = (long)(int)uVar5;
    if ((int)uVar5 < ref_cell->size_per) {
      nodes[lVar10] = -1;
    }
    uVar3 = 1000000;
    if ((uint)ncell < 1000000) {
      uVar3 = ncell;
    }
    if ((int)(uVar5 * uVar3) < 0) {
      pcVar7 = "malloc c2n of REF_INT negative";
      uVar4 = 499;
LAB_001bec36:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar4,"ref_import_bin_ugrid_c2n",pcVar7);
      return 1;
    }
    local_d8 = (REF_INT *)malloc((ulong)(uVar5 * uVar3) << 2);
    if (local_d8 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",499,
             "ref_import_bin_ugrid_c2n","malloc c2n of REF_INT NULL");
      return 2;
    }
    uVar12 = 0;
    uVar11 = 0;
    if (0 < (int)uVar5) {
      uVar11 = (ulong)uVar5;
    }
    local_b8 = lVar10 * 4;
    local_c8 = file;
    local_c0 = lVar10;
    local_b0 = ref_cell;
    while (pRVar6 = local_d8, uVar5 = ncell - (int)uVar12, uVar5 != 0 && (int)uVar12 <= ncell) {
      if ((int)uVar3 < (int)uVar5) {
        uVar5 = uVar3;
      }
      local_d0 = uVar12;
      uVar1 = ref_import_bin_ugrid_chunk(local_c8,swap,fat,uVar5 * (int)local_c0,local_d8);
      if (uVar1 != 0) {
        pcVar7 = "c2n";
        uVar4 = 0x1f8;
LAB_001bec09:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               uVar4,"ref_import_bin_ugrid_c2n",(ulong)uVar1,pcVar7);
        return uVar1;
      }
      uVar12 = 0;
      if (0 < (int)uVar5) {
        uVar12 = (ulong)uVar5;
      }
      uVar9 = 0;
      while (uVar9 != uVar12) {
        for (uVar2 = 0; uVar11 != uVar2; uVar2 = uVar2 + 1) {
          nodes[uVar2] = pRVar6[uVar2] + -1;
        }
        uVar1 = ref_cell_add(local_b0,nodes,&new_cell);
        if (uVar1 != 0) {
          pcVar7 = "new cell";
          uVar4 = 0x1fd;
          goto LAB_001bec09;
        }
        iVar8 = (int)uVar9;
        uVar9 = uVar9 + 1;
        pRVar6 = (REF_INT *)((long)pRVar6 + local_b8);
        if ((int)local_d0 + iVar8 != new_cell) {
          pcVar7 = "cell index";
          uVar4 = 0x1fe;
          goto LAB_001bec36;
        }
      }
      uVar12 = (ulong)(uVar5 + (int)local_d0);
    }
    free(local_d8);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid_c2n(REF_CELL ref_cell,
                                                   REF_INT ncell, FILE *file,
                                                   REF_BOOL swap,
                                                   REF_BOOL fat) {
  REF_INT node_per, max_chunk, nread, chunk, cell, node, new_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *c2n;

  if (0 < ncell) {
    /* to skip boundary tag */
    if (ref_cell_size_per(ref_cell) > ref_cell_node_per(ref_cell))
      nodes[ref_cell_node_per(ref_cell)] = REF_EMPTY;
    node_per = ref_cell_node_per(ref_cell);
    max_chunk = MIN(1000000, ncell);
    ref_malloc(c2n, node_per * max_chunk, REF_INT);
    nread = 0;
    while (nread < ncell) {
      chunk = MIN(max_chunk, ncell - nread);
      RSS(ref_import_bin_ugrid_chunk(file, swap, fat, node_per * chunk, c2n),
          "c2n");
      for (cell = 0; cell < chunk; cell++) {
        for (node = 0; node < node_per; node++) {
          nodes[node] = c2n[node + node_per * cell] - 1;
        }
        RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new cell");
        RES(cell + nread, new_cell, "cell index");
      }
      nread += chunk;
    }
    ref_free(c2n);
  }

  return REF_SUCCESS;
}